

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O0

void solvhandler(void)

{
  int listnum_00;
  Item *pIVar1;
  Symbol *fun_00;
  short sVar2;
  int iVar3;
  int iVar4;
  int unaff_retaddr;
  long in_stack_00000008;
  Item *in_stack_00000010;
  int cvodemethod_;
  int steadystate;
  int btype;
  int listnum;
  int numeqn;
  Symbol *method;
  Symbol *fun;
  List *errstmt;
  Item *follow;
  Item *qsol;
  Item *lq;
  int in_stack_00000080;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Symbol *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  int iVar6;
  Symbol *local_30;
  anon_union_8_4_46e41722_for_element aVar7;
  Symbol *fun_01;
  Item *qsol_00;
  Item *local_8;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  init_disc_vars();
  local_8 = solvq->next;
  while (local_8 != solvq) {
    iVar6 = 0;
    iVar3 = (int)local_8->itemtype;
    if (iVar3 < 0) {
      sVar2 = -local_8->itemtype;
      local_8->itemtype = sVar2;
      iVar3 = (int)sVar2;
      iVar6 = 1;
      check_ss_consist((Item *)CONCAT44(iVar3,1));
    }
    qsol_00 = (local_8->element).itm;
    pIVar1 = local_8->next;
    local_30 = (pIVar1->element).sym;
    iVar5 = 0;
    if ((local_30 != (Symbol *)0x0) && (iVar4 = strcmp(local_30->name,"after_cvode"), iVar4 == 0)) {
      local_30 = (Symbol *)0x0;
      (pIVar1->element).itm = (Item *)0x0;
      iVar5 = 1;
    }
    if ((local_30 != (Symbol *)0x0) && (iVar4 = strcmp(local_30->name,"cvode_t"), iVar4 == 0)) {
      local_30 = (Symbol *)0x0;
      (pIVar1->element).itm = (Item *)0x0;
      iVar5 = 2;
    }
    if ((local_30 != (Symbol *)0x0) && (iVar4 = strcmp(local_30->name,"cvode_v"), iVar4 == 0)) {
      local_30 = (Symbol *)0x0;
      (pIVar1->element).itm = (Item *)0x0;
      iVar5 = 3;
    }
    pIVar1 = pIVar1->next;
    aVar7 = pIVar1->element;
    fun_00 = (qsol_00->element).sym;
    iVar4 = fun_00->used;
    listnum_00 = (fun_00->u).i;
    fun_01 = (Symbol *)qsol_00->next;
    if ((local_30 != (Symbol *)0x0) && ((local_30->subtype & fun_00->subtype) == 0)) {
      sprintf(buf,"Method %s can\'t be used with Block %s",local_30->name,fun_00->name);
      diag((char *)in_stack_ffffffffffffffb0,
           (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    in_stack_ffffffffffffffb0 = (Symbol *)fun_00->subtype;
    if (in_stack_ffffffffffffffb0 == (Symbol *)0x80) {
      if (iVar3 == 0x130) {
        whileloop(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        if (iVar5 == 1) {
          cvode_interface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
        }
        if (iVar5 == 2) {
          cvode_interface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
          insertstr((Item *)in_stack_ffffffffffffffb0,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          cvode_nrn_cur_solve_ = fun_00;
        }
        if (iVar5 == 3) {
          cvode_interface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
          insertstr((Item *)in_stack_ffffffffffffffb0,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          cvode_nrn_current_solve_ = fun_00;
        }
      }
      sprintf(buf," %s();\n",fun_00->name);
      replacstr((Item *)in_stack_ffffffffffffffb0,
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      sprintf(buf,"{ %s(_threadargs_); }\n",fun_00->name);
      vectorize_substitute
                ((Item *)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x200) {
      if (local_30 == (Symbol *)0x0) {
        local_30 = lookup((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      if ((iVar3 == 0x130) && (iVar6 == 0)) {
        iVar4 = strcmp(local_30->name,"cnexp");
        if ((iVar4 != 0) &&
           ((iVar4 = strcmp(local_30->name,"derivimplicit"), iVar4 != 0 &&
            (iVar4 = strcmp(local_30->name,"euler"), iVar4 != 0)))) {
          fprintf(_stderr,"Notice: %s is not thread safe. Complain to Hines\n",local_30->name);
          vectorize = 0;
          sprintf(buf," %s();\n",fun_00->name);
          insertstr((Item *)in_stack_ffffffffffffffb0,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        }
        sens_nonlin_out((Item *)CONCAT44(iVar3,iVar6),
                        (Symbol *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
        cvode_interface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa8);
      }
      in_stack_ffffffffffffffa8 = iVar3;
      if (iVar3 == 0x130) {
        whileloop(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        in_stack_ffffffffffffffa8 = iVar3;
      }
      iVar3 = in_stack_ffffffffffffffa8;
      solv_diffeq(lq,(Symbol *)qsol,(Symbol *)follow,errstmt._4_4_,(int)errstmt,fun._4_4_,
                  in_stack_00000080);
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x400) {
      if (local_30 == (Symbol *)0x0) {
        local_30 = lookup((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      if ((iVar3 == 0x130) && ((local_30->subtype & 0x200U) != 0)) {
        fprintf(_stderr,
                "Notice: KINETIC with is thread safe only with METHOD sparse. Complain to Hines\n");
        vectorize = 0;
        sprintf(buf," %s();\n",fun_00->name);
        insertstr((Item *)in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        sens_nonlin_out((Item *)CONCAT44(iVar3,iVar6),
                        (Symbol *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
      }
      if (iVar3 == 0x130) {
        whileloop(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        iVar6 = strcmp(local_30->name,"sparse");
        if (iVar6 == 0) {
          cvode_interface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
          cvode_kinetic(qsol_00,fun_01,aVar7._4_4_,aVar7._0_4_);
          single_channel(qsol_00,fun_00,iVar4,listnum_00);
        }
      }
      in_stack_ffffffffffffffa8 = iVar3;
      iVar3 = in_stack_ffffffffffffffa8;
      solv_diffeq(lq,(Symbol *)qsol,(Symbol *)follow,errstmt._4_4_,(int)errstmt,fun._4_4_,
                  in_stack_00000080);
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x800) {
      fprintf(_stderr,"Notice: NONLINEAR is not thread safe.\n");
      vectorize = 0;
      if (local_30 == (Symbol *)0x0) {
        lookup((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      solv_nonlin((Item *)CONCAT44(iVar3,iVar6),(Symbol *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                  in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x1000) {
      fprintf(_stderr,"Notice: DISCRETE is not thread safe.\n");
      vectorize = 0;
      if (iVar3 == 0x130) {
        whileloop(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      }
      sprintf(buf,"0; %s += d%s; %s();\n",indepsym->name,indepsym->name,fun_00->name);
      replacstr((Item *)in_stack_ffffffffffffffb0,
                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x4000) {
      fprintf(_stderr,"Notice: PARTIAL is not thread safe.\n");
      vectorize = 0;
      if (iVar3 == 0x130) {
        whileloop(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      }
      solv_partial(qsol_00,fun_01);
    }
    else if (in_stack_ffffffffffffffb0 == (Symbol *)0x10000) {
      fprintf(_stderr,"Notice: LINEAR is not thread safe.\n");
      vectorize = 0;
      if (local_30 == (Symbol *)0x0) {
        lookup((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      solv_lineq((Item *)CONCAT44(iVar3,iVar6),(Symbol *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else {
      diag((char *)in_stack_ffffffffffffffb0,
           (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    if (iVar3 == 0x130) {
      cvode_valid();
    }
    insertstr((Item *)in_stack_ffffffffffffffb0,
              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    move((Item *)in_stack_ffffffffffffffb0,
         (Item *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),(Item *)0x1107ac);
    if ((aVar7.itm)->next == (aVar7.itm)->prev) {
      vectorize_substitute
                ((Item *)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      vectorize_substitute
                ((Item *)in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      fprintf(_stderr,"Notice: SOLVE with ERROR is not thread safe.\n");
      vectorize = 0;
    }
    freelist((List **)in_stack_ffffffffffffffb0);
    local_8 = pIVar1->next;
  }
  return;
}

Assistant:

void solvhandler()
{
	Item *lq, *qsol, *follow;
	List *errstmt;
	Symbol *fun, *method;
	int numeqn, listnum, btype, steadystate;
	int cvodemethod_;
	
	if (!solvq)
		solvq = newlist();
	init_disc_vars(); /*why not here?*/
	ITERATE(lq, solvq) { /* remember it goes by 3's */
		steadystate=0;
		btype = lq->itemtype;
		if (btype < 0) {
			btype = lq->itemtype = -btype;
			steadystate = 1;
			check_ss_consist(lq);
		}
		qsol = ITM(lq);
		lq = lq->next;
		method = SYM(lq);
#if CVODE
		cvodemethod_ = 0;
		if (method && strcmp(method->name, "after_cvode") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 1;
		}
		if (method && strcmp(method->name, "cvode_t") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 2;
		}
		if (method && strcmp(method->name, "cvode_v") == 0) {
			method = (Symbol*)0;
			lq->element.sym = (Symbol*)0;
			cvodemethod_ = 3;
		}
#endif	
		lq = lq->next;
		errstmt = LST(lq);
		/* err stmt handling assumes qsol->next is where it goes. */
		fun = SYM(qsol);
		numeqn = fun->used;
		listnum =fun->u.i;
		follow = qsol->next; /* where p[0] gets updated */
		/* Check consistency of method and block type */
		if (method && !(method->subtype & fun->subtype)) {
			Sprintf(buf, "Method %s can't be used with Block %s",
				method->name, fun->name);
			diag(buf, (char *)0);
		}
		
		switch (fun->subtype) {

		case DERF:
			if (method == SYM0) {
				method = lookup("adrunge");
			}
			if (btype == BREAKPOINT && !steadystate) {
				/* derivatives recalculated after while loop */
if (strcmp(method->name, "cnexp") != 0 && strcmp(method->name, "derivimplicit") != 0 && strcmp(method->name, "euler") != 0) {
fprintf(stderr, "Notice: %s is not thread safe. Complain to Hines\n", method->name);
				vectorize = 0;
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
		}
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
#if CVODE
				cvode_interface(fun, listnum, numeqn);
#endif
			}
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, steadystate);
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case KINF:
			if (method == SYM0) {
				method = lookup("_advance");
			}
			if (btype == BREAKPOINT && (method->subtype & DERF)) {
#if VECTORIZE
fprintf(stderr, "Notice: KINETIC with is thread safe only with METHOD sparse. Complain to Hines\n");
				vectorize = 0;
#endif
				/* derivatives recalculated after while loop */
				Sprintf(buf, " %s();\n", fun->name);
				Insertstr(follow, buf);
				/* envelope calls go after the while loop */
				sens_nonlin_out(follow, fun);
			}
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, steadystate);
#if CVODE
	if (strcmp(method->name, "sparse") == 0) {
				cvode_interface(fun, listnum, numeqn);
				cvode_kinetic(qsol, fun, numeqn, listnum);
				single_channel(qsol, fun, numeqn, listnum);
	}
#endif
			}
			solv_diffeq(qsol, fun,  method, numeqn, listnum, steadystate, btype);
			break;
		case NLINF:
#if VECTORIZE
fprintf(stderr, "Notice: NONLINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("newton");
			}
			solv_nonlin(qsol, fun, method, numeqn, listnum);
			break;
		case LINF:
#if VECTORIZE
fprintf(stderr, "Notice: LINEAR is not thread safe.\n");
			vectorize = 0;
#endif
			if (method == SYM0) {
				method = lookup("simeq");
			}
			solv_lineq(qsol, fun, method, numeqn, listnum);
			break;
		case DISCF:
#if VECTORIZE
fprintf(stderr, "Notice: DISCRETE is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DISCRETE, 0);
			Sprintf(buf, "0; %s += d%s; %s();\n",
				indepsym->name, indepsym->name, fun->name);
			replacstr(qsol, buf);
			break;
#if 1	/* really wanted? */
		case PROCED:
			if (btype == BREAKPOINT) {
				whileloop(qsol, (long)DERF, 0);
#if CVODE
	if (cvodemethod_ == 1) { /*after_cvode*/
				cvode_interface(fun, listnum, 0);
	}
	if (cvodemethod_ == 2) { /*cvode_t*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_cur_solve_ = fun;
	}
	if (cvodemethod_ == 3) { /*cvode_t_v*/
				cvode_interface(fun, listnum, 0);
				insertstr(qsol, "if (!cvode_active_)");
				cvode_nrn_current_solve_ = fun;
	}
#endif
			}
			Sprintf(buf, " %s();\n", fun->name);
			replacstr(qsol, buf);
#if VECTORIZE
	Sprintf(buf, "{ %s(_threadargs_); }\n",
		fun->name);
	vectorize_substitute(qsol, buf);
#endif
			break;
#endif
		case PARF:
#if VECTORIZE
fprintf(stderr, "Notice: PARTIAL is not thread safe.\n");
			vectorize = 0;
#endif
			if (btype == BREAKPOINT) whileloop(qsol, (long)DERF, 0);
			solv_partial(qsol, fun);
			break;
		default:
			diag("Illegal or unimplemented SOLVE type: ", fun->name);
			break;
		}
#if CVODE
		if (btype == BREAKPOINT) {
			cvode_valid();
		}
#endif
	/* add the error check */
	Insertstr(qsol, "error =");
	move(errstmt->next, errstmt->prev, qsol->next);
#if VECTORIZE
	if (errstmt->next == errstmt->prev) {
		vectorize_substitute(qsol->next, "");
		vectorize_substitute(qsol->prev, "");
	}else{
fprintf(stderr, "Notice: SOLVE with ERROR is not thread safe.\n");
		vectorize = 0;
	}
#endif
	freelist(&errstmt);
	/* under all circumstances, on return from model,
	 p[0] = current indepvar */
	/* obviously ok if indepvar is original; if it has been changed
	away from time
	then _sav_indep will be reset to starting value of original when
	initmodel is called on every call to model */
#if NMODL
#else
		if (btype == BREAKPOINT) {
#if SIMSYS
			Sprintf(buf, "_sav_indep = %s;\n", indepsym->name);
#else
			Sprintf(buf, "_sav_indep = _p[_indepindex];\n");
#endif
			Insertstr(follow, buf);
		}
#endif
	}
}